

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitGeneratingBooleanExpression
               (ParseNode *expr,ByteCodeLabel trueLabel,bool truefallthrough,
               ByteCodeLabel falseLabel,bool falsefallthrough,RegSlot writeto,bool reuseLoc,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  RegSlot R1;
  ParseNode *pnode1;
  ByteCodeLabel BVar2;
  ByteCodeLabel BVar3;
  ParseNodeUni *pPVar4;
  ParseNodeBin *pPVar5;
  RegSlot RVar6;
  bool truefallthrough_00;
  OpCode OVar7;
  ParseNodePtr expr_00;
  bool falsefallthrough_00;
  ByteCodeWriter *pBVar8;
  ByteCodeWriter *local_50;
  ByteCodeLabel local_44;
  
  OVar1 = expr->nop;
  if (OVar1 < knopLogNot) {
    if (OVar1 == knopName) {
switchD_008131d5_caseD_30:
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,reuseLoc + Ld_A,writeto,expr->location);
      if (truefallthrough || falsefallthrough) {
        if (truefallthrough && !falsefallthrough) {
          RVar6 = expr->location;
          OVar7 = BrFalse_A;
          trueLabel = falseLabel;
        }
        else {
          if (!falsefallthrough || truefallthrough) goto LAB_008136d3;
          RVar6 = expr->location;
          OVar7 = BrTrue_A;
        }
        goto LAB_008136cb;
      }
LAB_008133cd:
      Js::ByteCodeWriter::BrReg1(&byteCodeGenerator->m_writer,BrTrue_A,trueLabel,expr->location);
      trueLabel = falseLabel;
    }
    else if (OVar1 == knopFalse) {
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,reuseLoc + LdFalse,writeto);
      trueLabel = falseLabel;
      if (falsefallthrough) goto LAB_008136d3;
    }
    else {
      if (OVar1 != knopTrue) goto switchD_008131d5_caseD_2f;
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,reuseLoc + LdTrue,writeto);
      if (truefallthrough) goto LAB_008136d3;
    }
    Js::ByteCodeWriter::Br(&byteCodeGenerator->m_writer,trueLabel);
  }
  else {
    switch(OVar1) {
    case knopEq:
    case knopNe:
    case knopLt:
    case knopLe:
    case knopGe:
    case knopGt:
    case knopEqv:
    case knopNEqv:
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      pnode1 = pPVar5->pnode1;
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      EmitBinaryOpnds(pnode1,pPVar5->pnode2,byteCodeGenerator,funcInfo,0xffffffff);
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode2);
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
      FuncInfo::AcquireLoc(funcInfo,expr);
      OVar7 = nopToCMOp[expr->nop];
      RVar6 = expr->location;
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      R1 = pPVar5->pnode1->location;
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      Js::ByteCodeWriter::Reg3(&byteCodeGenerator->m_writer,OVar7,RVar6,R1,pPVar5->pnode2->location)
      ;
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,reuseLoc + Ld_A,writeto,expr->location);
      if (!truefallthrough && !falsefallthrough) goto LAB_008133cd;
      if (truefallthrough && !falsefallthrough) {
        RVar6 = expr->location;
        OVar7 = BrFalse_A;
        trueLabel = falseLabel;
      }
      else {
        if (!falsefallthrough || truefallthrough) goto LAB_008136d3;
        RVar6 = expr->location;
        OVar7 = BrTrue_A;
      }
LAB_008136cb:
      Js::ByteCodeWriter::BrReg1(&byteCodeGenerator->m_writer,OVar7,trueLabel,RVar6);
      goto LAB_008136d3;
    case knopDot:
      goto switchD_008131d5_caseD_30;
    case knopLogOr:
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      BVar3 = Js::ByteCodeWriter::DefineLabel(&byteCodeGenerator->m_writer);
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      expr_00 = pPVar5->pnode1;
      truefallthrough_00 = false;
      falsefallthrough_00 = true;
      BVar2 = trueLabel;
      local_44 = BVar3;
      break;
    case knopLogAnd:
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      BVar2 = Js::ByteCodeWriter::DefineLabel(&byteCodeGenerator->m_writer);
      pPVar5 = ParseNode::AsParseNodeBin(expr);
      expr_00 = pPVar5->pnode1;
      truefallthrough_00 = true;
      falsefallthrough_00 = false;
      BVar3 = falseLabel;
      local_44 = BVar2;
      break;
    default:
      if (OVar1 == knopLogNot) {
        ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
        pBVar8 = &byteCodeGenerator->m_writer;
        BVar2 = Js::ByteCodeWriter::DefineLabel(pBVar8);
        BVar3 = Js::ByteCodeWriter::DefineLabel(pBVar8);
        pPVar4 = ParseNode::AsParseNodeUni(expr);
        EmitBooleanExpression(pPVar4->pnode1,BVar3,BVar2,byteCodeGenerator,funcInfo,false,true);
        Js::ByteCodeWriter::MarkLabel(pBVar8,BVar2);
        Js::ByteCodeWriter::Reg1(pBVar8,reuseLoc + LdTrue,writeto);
        Js::ByteCodeWriter::Br(pBVar8,trueLabel);
        Js::ByteCodeWriter::MarkLabel(pBVar8,BVar3);
        Js::ByteCodeWriter::Reg1(pBVar8,LdFalse_ReuseLoc,writeto);
        if (!falsefallthrough) {
          Js::ByteCodeWriter::Br(pBVar8,falseLabel);
        }
        pPVar4 = ParseNode::AsParseNodeUni(expr);
        FuncInfo::ReleaseLoc(funcInfo,pPVar4->pnode1);
        goto LAB_008136d3;
      }
    case knopCall:
    case knopAsg:
    case knopInstOf:
    case knopIn:
    case knopComma:
switchD_008131d5_caseD_2f:
      Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
      pBVar8 = &byteCodeGenerator->m_writer;
      Js::ByteCodeWriter::Reg2(pBVar8,reuseLoc + Ld_A,writeto,expr->location);
      if (!truefallthrough && !falsefallthrough) {
        Js::ByteCodeWriter::BrReg1(pBVar8,BrTrue_A,trueLabel,expr->location);
        Js::ByteCodeWriter::Br(pBVar8,falseLabel);
        return;
      }
      if (truefallthrough && !falsefallthrough) {
        RVar6 = expr->location;
        OVar7 = BrFalse_A;
        trueLabel = falseLabel;
      }
      else {
        if (!falsefallthrough || truefallthrough) {
          return;
        }
        RVar6 = expr->location;
        OVar7 = BrTrue_A;
      }
      Js::ByteCodeWriter::BrReg1(pBVar8,OVar7,trueLabel,RVar6);
      return;
    }
    local_50 = &byteCodeGenerator->m_writer;
    EmitGeneratingBooleanExpression
              (expr_00,BVar2,truefallthrough_00,BVar3,falsefallthrough_00,writeto,reuseLoc,
               byteCodeGenerator,funcInfo);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
    Js::ByteCodeWriter::MarkLabel(local_50,local_44);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    EmitGeneratingBooleanExpression
              (pPVar5->pnode2,trueLabel,truefallthrough,falseLabel,falsefallthrough,writeto,true,
               byteCodeGenerator,funcInfo);
    pPVar5 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode2);
  }
LAB_008136d3:
  Js::ByteCodeWriter::EndStatement(&byteCodeGenerator->m_writer,expr);
  return;
}

Assistant:

void EmitGeneratingBooleanExpression(ParseNode *expr, Js::ByteCodeLabel trueLabel, bool truefallthrough, Js::ByteCodeLabel falseLabel, bool falsefallthrough, Js::RegSlot writeto,
    bool reuseLoc, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    switch (expr->nop)
    {

    case knopLogOr:
    {
        byteCodeGenerator->StartStatement(expr);
        Js::ByteCodeLabel leftFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode1, trueLabel, false, leftFalse, true, writeto, reuseLoc, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftFalse);
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, truefallthrough, falseLabel, falsefallthrough, writeto, true, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        byteCodeGenerator->EndStatement(expr);
        break;
    }

    case knopLogAnd:
    {
        byteCodeGenerator->StartStatement(expr);
        Js::ByteCodeLabel leftTrue = byteCodeGenerator->Writer()->DefineLabel();
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode1, leftTrue, true, falseLabel, false, writeto, reuseLoc, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftTrue);
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, truefallthrough, falseLabel, falsefallthrough, writeto, true, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        byteCodeGenerator->EndStatement(expr);
        break;
    }

    case knopLogNot:
    {
        byteCodeGenerator->StartStatement(expr);
        // this time we want a boolean expression, since Logical Not is nice and only returns true or false
        Js::ByteCodeLabel emitTrue = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel emitFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeUni()->pnode1, emitFalse, emitTrue, byteCodeGenerator, funcInfo, false, true);
        byteCodeGenerator->Writer()->MarkLabel(emitTrue);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdTrue_ReuseLoc : Js::OpCode::LdTrue, writeto);
        byteCodeGenerator->Writer()->Br(trueLabel);
        byteCodeGenerator->Writer()->MarkLabel(emitFalse);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, writeto);
        if (!falsefallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        funcInfo->ReleaseLoc(expr->AsParseNodeUni()->pnode1);
        byteCodeGenerator->EndStatement(expr);
        break;
    }
    case knopEq:
    case knopEqv:
    case knopNEqv:
    case knopNe:
    case knopLt:
    case knopLe:
    case knopGe:
    case knopGt:
        byteCodeGenerator->StartStatement(expr);
        EmitBinaryOpnds(expr->AsParseNodeBin()->pnode1, expr->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        funcInfo->AcquireLoc(expr);
        byteCodeGenerator->Writer()->Reg3(nopToCMOp[expr->nop], expr->location, expr->AsParseNodeBin()->pnode1->location,
            expr->AsParseNodeBin()->pnode2->location);
        byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
        // The inliner likes small bytecode
        if (!(truefallthrough || falsefallthrough))
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        else if (truefallthrough && !falsefallthrough) {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
        }
        else if (falsefallthrough && !truefallthrough) {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    case knopTrue:
        byteCodeGenerator->StartStatement(expr);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdTrue_ReuseLoc : Js::OpCode::LdTrue, writeto);
        if (!truefallthrough)
        {
            byteCodeGenerator->Writer()->Br(trueLabel);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    case knopFalse:
        byteCodeGenerator->StartStatement(expr);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdFalse_ReuseLoc : Js::OpCode::LdFalse, writeto);
        if (!falsefallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    default:
        // Note: we usually release the temp assigned to a node after we Emit it.
        // But in this case, EmitBooleanExpression is just a wrapper around a normal Emit call,
        // and the caller of EmitBooleanExpression expects to be able to release this register.

        // For diagnostics purposes, register the name and dot to the statement list.
        if (expr->nop == knopName || expr->nop == knopDot)
        {
            byteCodeGenerator->StartStatement(expr);
            Emit(expr, byteCodeGenerator, funcInfo, false);
            byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
            // The inliner likes small bytecode
            if (!(truefallthrough || falsefallthrough))
            {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
            else if (truefallthrough && !falsefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
            }
            else if (falsefallthrough && !truefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            }
            byteCodeGenerator->EndStatement(expr);
        }
        else
        {
            Emit(expr, byteCodeGenerator, funcInfo, false);
            byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
            // The inliner likes small bytecode
            if (!(truefallthrough || falsefallthrough))
            {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
            else if (truefallthrough && !falsefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
            }
            else if (falsefallthrough && !truefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            }
        }
        break;
    }
}